

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void __thiscall
AnonADIOSFile::AnonADIOSFile
          (AnonADIOSFile *this,string *FileName,RemoteFileMode mode,bool RowMajorArrays)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  byte in_CL;
  undefined4 in_EDX;
  string *in_RSI;
  undefined8 *in_RDI;
  ArrayOrdering ArrayOrder;
  Mode adios_read_mode;
  string local_78 [36];
  uint local_54;
  string local_50 [52];
  undefined4 local_1c;
  byte local_15;
  undefined4 local_14;
  
  local_15 = in_CL & 1;
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[3] = 0xffffffffffffffff;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::__cxx11::string::string((string *)(in_RDI + 8));
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  local_1c = 2;
  std::__cxx11::string::operator=((string *)(in_RDI + 8),in_RSI);
  lf_random_string_abi_cxx11_();
  std::__cxx11::string::operator=((string *)(in_RDI + 4),local_50);
  std::__cxx11::string::~string(local_50);
  local_54 = (byte)~local_15 & 1;
  std::__cxx11::string::string(local_78,(string *)(in_RDI + 4));
  uVar1 = adios2::core::ADIOS::DeclareIO(adios,local_78,local_54);
  *in_RDI = uVar1;
  std::__cxx11::string::~string(local_78);
  *(undefined4 *)(in_RDI + 0xe) = local_14;
  if (*(int *)(in_RDI + 0xe) == 1) {
    local_1c = 4;
  }
  uVar1 = adios2::core::IO::Open((string *)*in_RDI,(Mode)in_RSI);
  in_RDI[1] = uVar1;
  puVar2 = (undefined8 *)std::__cxx11::string::c_str();
  in_RDI[2] = *puVar2;
  return;
}

Assistant:

AnonADIOSFile(std::string FileName, EVPathRemoteCommon::RemoteFileMode mode,
                  bool RowMajorArrays)
    {
        Mode adios_read_mode = adios2::Mode::Read;
        m_FileName = FileName;
        m_IOname = lf_random_string();
        ArrayOrdering ArrayOrder =
            RowMajorArrays ? ArrayOrdering::RowMajor : ArrayOrdering::ColumnMajor;
        m_io = &adios.DeclareIO(m_IOname, ArrayOrder);
        m_mode = mode;
        if (m_mode == RemoteOpenRandomAccess)
            adios_read_mode = adios2::Mode::ReadRandomAccess;
        m_engine = &m_io->Open(FileName, adios_read_mode);
        memcpy(&m_ID, m_IOname.c_str(), sizeof(m_ID));
    }